

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetReference<void*>
          (BaseDictionary<void*,Js::IsInstInlineCache*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,void **key,IsInstInlineCache ***value,int *index)

{
  hash_t hVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint depth;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    hVar1 = PrimePolicy::ModPrime
                      ((uint)((ulong)*key >> 4) & 0x7fffffff,*(uint *)(this + 0x1c),
                       *(int *)(this + 0x2c));
    uVar4 = *(uint *)(lVar2 + (ulong)hVar1 * 4);
    depth = 0;
    if (-1 < (int)uVar4) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      do {
        uVar3 = (ulong)uVar4;
        if (*(void **)(lVar2 + 0x10 + uVar3 * 0x18) == *key) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
            lVar2 = *(long *)(this + 8);
          }
          *value = (IsInstInlineCache **)(lVar2 + uVar3 * 0x18);
          *index = uVar4;
          return true;
        }
        depth = depth + 1;
        uVar4 = *(uint *)(lVar2 + uVar3 * 0x18 + 8);
      } while (-1 < (int)uVar4);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return false;
}

Assistant:

bool TryGetReference(const TLookup& key, TValue** value, int* index) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = &entries[i].Value();
                *index = i;
                return true;
            }
            return false;
        }